

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *pcVar1;
  allocator *paVar2;
  char *pcVar3;
  string *in_RDI;
  allocator local_12;
  allocator local_11;
  
  pcVar3 = FLAGS_gtest_output_abi_cxx11_;
  if (FLAGS_gtest_output_abi_cxx11_ == (char *)0x0) {
    pcVar3 = "";
    paVar2 = &local_11;
  }
  else {
    pcVar1 = strchr(FLAGS_gtest_output_abi_cxx11_,0x3a);
    if (pcVar1 != (char *)0x0) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char_const*>();
      return in_RDI;
    }
    paVar2 = &local_12;
  }
  std::__cxx11::string::string((string *)in_RDI,pcVar3,paVar2);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL) return std::string("");

  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == NULL) ?
      std::string(gtest_output_flag) :
      std::string(gtest_output_flag, colon - gtest_output_flag);
}